

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.c
# Opt level: O2

uint32_t * zxspectrum_claim_screen(zxspectrum_t *state)

{
  zxspectrum_t *pzVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)(state[1].screen.pixels + 0x18));
  if ((*(int *)(state[1].screen.pixels + 0x40) < *(int *)(state[1].screen.pixels + 0x48)) &&
     (*(int *)(state[1].screen.pixels + 0x44) < *(int *)(state[1].screen.pixels + 0x4c))) {
    zxscreen_convert(state[1].screen.pixels + 0x58,(uint *)(state[2].screen.pixels + 0x28),
                     (zxbox_t *)(state[1].screen.pixels + 0x40));
    pzVar1 = state + 1;
    (pzVar1->screen).pixels[0x40] = 0xff;
    (pzVar1->screen).pixels[0x41] = 0xff;
    (pzVar1->screen).pixels[0x42] = 0xff;
    (pzVar1->screen).pixels[0x43] = '\x7f';
    (pzVar1->screen).pixels[0x44] = 0xff;
    (pzVar1->screen).pixels[0x45] = 0xff;
    (pzVar1->screen).pixels[0x46] = 0xff;
    (pzVar1->screen).pixels[0x47] = '\x7f';
    pzVar1 = state + 1;
    (pzVar1->screen).pixels[0x48] = '\0';
    (pzVar1->screen).pixels[0x49] = '\0';
    (pzVar1->screen).pixels[0x4a] = '\0';
    (pzVar1->screen).pixels[0x4b] = 0x80;
    (pzVar1->screen).pixels[0x4c] = '\0';
    (pzVar1->screen).pixels[0x4d] = '\0';
    (pzVar1->screen).pixels[0x4e] = '\0';
    (pzVar1->screen).pixels[0x4f] = 0x80;
  }
  return (uint32_t *)(state[2].screen.pixels + 0x28);
}

Assistant:

uint32_t *zxspectrum_claim_screen(zxspectrum_t *state)
{
  zxspectrum_private_t *prv = (zxspectrum_private_t *) state;

  mutex_lock(prv->lock);

  /* Check for any changes */
  if (zxbox_is_valid(&prv->dirty))
  {
    // Convert the screen only when it's asked for
#ifdef __riscos
    zxscreen_convert16(prv->screen_copy.pixels, prv->converted, &prv->dirty);
#else
    zxscreen_convert(prv->screen_copy.pixels, prv->converted, &prv->dirty);
#endif

    /* Invalidate the dirty region once complete */
    zxbox_invalidate(&prv->dirty);
  }

  return prv->converted;
}